

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::ConvertToNinjaPath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  const_reference ppcVar1;
  cmOutputConverter *this_00;
  cmState *this_01;
  char *pcVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_02;
  string local_88;
  allocator local_51;
  string local_50;
  undefined1 local_29;
  value_type local_28;
  cmLocalNinjaGenerator *ng;
  string *path_local;
  cmGlobalNinjaGenerator *this_local;
  string *convPath;
  
  this_02 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
  ng = (cmLocalNinjaGenerator *)path;
  path_local = (string *)this;
  this_local = (cmGlobalNinjaGenerator *)__return_storage_ptr__;
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_02,0);
  local_28 = *ppcVar1;
  local_29 = 0;
  this_00 = &local_28->super_cmOutputConverter;
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_02,0);
  this_01 = cmLocalGenerator::GetState(*ppcVar1);
  pcVar2 = cmState::GetBinaryDirectory(this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar2,&local_51);
  cmOutputConverter::ConvertToRelativePath(__return_storage_ptr__,this_00,&local_50,(string *)ng);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  NinjaOutputPath(&local_88,this,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::ConvertToNinjaPath(
  const std::string& path) const
{
  cmLocalNinjaGenerator* ng =
    static_cast<cmLocalNinjaGenerator*>(this->LocalGenerators[0]);
  std::string convPath = ng->ConvertToRelativePath(
    this->LocalGenerators[0]->GetState()->GetBinaryDirectory(), path);
  convPath = this->NinjaOutputPath(convPath);
#ifdef _WIN32
  std::replace(convPath.begin(), convPath.end(), '/', '\\');
#endif
  return convPath;
}